

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O1

__type * __thiscall
NS::wrap<NS*,NS*,NS*,NS*>
          (__type *__return_storage_ptr__,NS *this,NS *first,NS *rest,NS *rest_1,NS *rest_2)

{
  N *pNVar1;
  __type local_48;
  
  pNVar1 = (N *)N::operator_new(0x78,this);
  (pNVar1->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar1->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar1->osi).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar1->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pNVar1->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar1->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar1->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(NS **)&(pNVar1->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>._M_u =
       first;
  *(__index_type *)
   ((long)&(pNVar1->data).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> + 0x20)
       = '\x03';
  wrap<NS*,NS*,NS*>(&local_48,this,rest,rest_1,rest_2);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>).
  super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*>.super__Tuple_impl<3UL,_N_*>
  .super__Head_base<3UL,_N_*,_false>._M_head_impl =
       (N *)local_48.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
            super__Tuple_impl<2UL,_N_*>.super__Head_base<2UL,_N_*,_false>._M_head_impl;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>).
  super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*>.
  super__Head_base<2UL,_N_*,_false>._M_head_impl =
       local_48.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Tuple_impl<1UL,_N_*,_N_*>.
       super__Head_base<1UL,_N_*,_false>._M_head_impl;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>).
  super__Tuple_impl<1UL,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl =
       local_48.super__Tuple_impl<0UL,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>._M_head_impl
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*>).
  super__Head_base<0UL,_N_*,_false>._M_head_impl = pNVar1;
  return __return_storage_ptr__;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }